

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceBase.hpp
# Opt level: O3

void __thiscall
Diligent::FenceBase<Diligent::EngineVkImplTraits>::DvpDeviceWait
          (FenceBase<Diligent::EngineVkImplTraits> *this,Uint64 Value)

{
  RenderDeviceVkImpl *pRVar1;
  __int_type_conflict3 EnqueuedValue;
  string msg;
  __atomic_base<unsigned_long> local_30;
  string local_28;
  
  pRVar1 = DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>::
           GetDevice(&this->
                      super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                    );
  if (((pRVar1->
       super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
       ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Features.NativeFence ==
       DEVICE_FEATURE_STATE_DISABLED) &&
     (local_30._M_i = (this->m_EnqueuedFenceValue).super___atomic_base<unsigned_long>._M_i,
     local_30._M_i < Value)) {
    FormatString<char[24],unsigned_long,char[59],unsigned_long,char[63]>
              (&local_28,(Diligent *)"Can not wait for value ",
               (char (*) [24])&stack0xffffffffffffffc8,
               (unsigned_long *)" that is greater than the last enqueued for signal value (",
               (char (*) [59])&local_30,
               (unsigned_long *)"). This is not supported when NativeFence feature is disabled.",
               (char (*) [63])Value);
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"DvpDeviceWait",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FenceBase.hpp"
               ,99);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void DvpDeviceWait(Uint64 Value)
    {
#ifdef DILIGENT_DEVELOPMENT
        if (!this->GetDevice()->GetFeatures().NativeFence)
        {
            auto EnqueuedValue = m_EnqueuedFenceValue.load();
            DEV_CHECK_ERR(Value <= EnqueuedValue,
                          "Can not wait for value ", Value, " that is greater than the last enqueued for signal value (", EnqueuedValue,
                          "). This is not supported when NativeFence feature is disabled.");
        }
#endif
    }